

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QPixmapIconEngineEntry>::copyAppend
          (QGenericArrayOps<QPixmapIconEngineEntry> *this,QPixmapIconEngineEntry *b,
          QPixmapIconEngineEntry *e)

{
  QPixmapIconEngineEntry *pQVar1;
  Data *pDVar2;
  Mode MVar3;
  State SVar4;
  long lVar5;
  QPixmapIconEngineEntry *this_00;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QPixmapIconEngineEntry>).ptr;
    lVar5 = (this->super_QArrayDataPointer<QPixmapIconEngineEntry>).size;
    do {
      this_00 = pQVar1 + lVar5;
      QPixmap::QPixmap(&this_00->pixmap,&b->pixmap);
      pDVar2 = (b->fileName).d.d;
      pQVar1[lVar5].fileName.d.d = pDVar2;
      pQVar1[lVar5].fileName.d.ptr = (b->fileName).d.ptr;
      pQVar1[lVar5].fileName.d.size = (b->fileName).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      MVar3 = b->mode;
      SVar4 = b->state;
      this_00->size = b->size;
      this_00->mode = MVar3;
      this_00->state = SVar4;
      b = b + 1;
      lVar5 = (this->super_QArrayDataPointer<QPixmapIconEngineEntry>).size + 1;
      (this->super_QArrayDataPointer<QPixmapIconEngineEntry>).size = lVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }